

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

value hello_world_class_impl_interface_static_get(klass cls,class_impl impl,accessor_type *accessor)

{
  int iVar1;
  char *__s1;
  long in_RDX;
  undefined4 *in_RSI;
  char *key;
  attribute attr;
  hello_world_class hello_world;
  value local_8;
  
  __s1 = (char *)attribute_name(*(undefined8 *)(in_RDX + 8));
  if (__s1 == (char *)0x0) {
    local_8 = (value)0x0;
  }
  else {
    iVar1 = strcmp(__s1,"a");
    if (iVar1 == 0) {
      local_8 = (value)value_create_int(*in_RSI);
    }
    else {
      iVar1 = strcmp(__s1,"b");
      if (iVar1 == 0) {
        local_8 = (value)value_create_float(in_RSI[1]);
      }
      else {
        iVar1 = strcmp(__s1,"c");
        if (iVar1 == 0) {
          local_8 = (value)value_create_string(in_RSI + 2,9);
        }
        else {
          local_8 = (value)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

value hello_world_class_impl_interface_static_get(klass cls, class_impl impl, struct accessor_type *accessor)
{
	hello_world_class hello_world = (hello_world_class)impl;
	attribute attr = accessor->data.attr;
	char *key = attribute_name(attr);

	(void)cls;

	if (key == NULL)
	{
		return NULL;
	}

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "a") == 0)
	{
		return value_create_int(hello_world->a);
	}
	else if (strcmp(key, "b") == 0)
	{
		return value_create_float(hello_world->b);
	}
	else if (strcmp(key, "c") == 0)
	{
		return value_create_string(hello_world->c, 9);
	}

	return NULL;
}